

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3SelectAddColumnTypeAndCollation(Parse *pParse,Table *pTab,Select *pSelect)

{
  sqlite3 *db;
  ExprList *pEVar1;
  Column *pCVar2;
  Expr *pExpr;
  char *__s;
  char cVar3;
  char *pcVar4;
  size_t sVar5;
  size_t sVar6;
  void *pvVar7;
  CollSeq *pCVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  NameContext sNC;
  NameContext local_68;
  
  db = pParse->db;
  if (db->mallocFailed == '\0') {
    local_68.nRef = 0;
    local_68.nErr = 0;
    local_68.ncFlags = 0;
    local_68._44_4_ = 0;
    local_68.uNC.pEList = (ExprList *)0x0;
    local_68.pNext = (NameContext *)0x0;
    local_68.pParse = (Parse *)0x0;
    local_68.pWinSelect = (Select *)0x0;
    local_68.pSrcList = pSelect->pSrc;
    if (0 < pTab->nCol) {
      pEVar1 = pSelect->pEList;
      pCVar2 = pTab->aCol;
      lVar11 = 0;
      lVar9 = 0;
      do {
        pExpr = *(Expr **)((long)&pEVar1->a[0].pExpr + lVar11);
        pcVar4 = columnTypeImpl(&local_68,pExpr);
        cVar3 = sqlite3ExprAffinity(pExpr);
        (&pCVar2->affinity)[lVar11] = cVar3;
        if (pcVar4 != (char *)0x0) {
          sVar5 = strlen(pcVar4);
          __s = *(char **)((long)&pCVar2->zName + lVar11);
          if (__s == (char *)0x0) {
            uVar12 = 0;
          }
          else {
            sVar6 = strlen(__s);
            uVar12 = (uint)sVar6 & 0x3fffffff;
          }
          uVar10 = (uint)sVar5 & 0x3fffffff;
          pvVar7 = sqlite3DbReallocOrFree(db,__s,(ulong)(uVar12 + uVar10 + 2));
          *(void **)((long)&pCVar2->zName + lVar11) = pvVar7;
          if (pvVar7 != (void *)0x0) {
            memcpy((void *)((long)pvVar7 + (ulong)uVar12 + 1),pcVar4,(ulong)(uVar10 + 1));
            (&pCVar2->colFlags)[lVar11] = (&pCVar2->colFlags)[lVar11] | 4;
          }
          cVar3 = (&pCVar2->affinity)[lVar11];
        }
        if (cVar3 == '\0') {
          (&pCVar2->affinity)[lVar11] = 'A';
        }
        pCVar8 = sqlite3ExprCollSeq(pParse,pExpr);
        if ((pCVar8 != (CollSeq *)0x0) && (*(long *)((long)&pCVar2->zColl + lVar11) == 0)) {
          pcVar4 = sqlite3DbStrDup(db,pCVar8->zName);
          *(char **)((long)&pCVar2->zColl + lVar11) = pcVar4;
        }
        lVar9 = lVar9 + 1;
        lVar11 = lVar11 + 0x20;
      } while (lVar9 < pTab->nCol);
    }
    pTab->szTabRow = 1;
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SelectAddColumnTypeAndCollation(
  Parse *pParse,        /* Parsing contexts */
  Table *pTab,          /* Add column type information to this table */
  Select *pSelect       /* SELECT used to determine types and collations */
){
  sqlite3 *db = pParse->db;
  NameContext sNC;
  Column *pCol;
  CollSeq *pColl;
  int i;
  Expr *p;
  struct ExprList_item *a;

  assert( pSelect!=0 );
  assert( (pSelect->selFlags & SF_Resolved)!=0 );
  assert( pTab->nCol==pSelect->pEList->nExpr || db->mallocFailed );
  if( db->mallocFailed ) return;
  memset(&sNC, 0, sizeof(sNC));
  sNC.pSrcList = pSelect->pSrc;
  a = pSelect->pEList->a;
  for(i=0, pCol=pTab->aCol; i<pTab->nCol; i++, pCol++){
    const char *zType;
    int n, m;
    p = a[i].pExpr;
    zType = columnType(&sNC, p, 0, 0, 0);
    /* pCol->szEst = ... // Column size est for SELECT tables never used */
    pCol->affinity = sqlite3ExprAffinity(p);
    if( zType ){
      m = sqlite3Strlen30(zType);
      n = sqlite3Strlen30(pCol->zName);
      pCol->zName = sqlite3DbReallocOrFree(db, pCol->zName, n+m+2);
      if( pCol->zName ){
        memcpy(&pCol->zName[n+1], zType, m+1);
        pCol->colFlags |= COLFLAG_HASTYPE;
      }
    }
    if( pCol->affinity==0 ) pCol->affinity = SQLITE_AFF_BLOB;
    pColl = sqlite3ExprCollSeq(pParse, p);
    if( pColl && pCol->zColl==0 ){
      pCol->zColl = sqlite3DbStrDup(db, pColl->zName);
    }
  }
  pTab->szTabRow = 1; /* Any non-zero value works */
}